

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_decode(aec_stream_conflict *strm,int flush)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  int status;
  internal_state_conflict *state;
  int local_4;
  
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10);
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x20) + *(long *)(in_RDI + 0x28);
  puVar1 = *(undefined8 **)(in_RDI + 0x40);
  do {
    iVar2 = (*(code *)*puVar1)(in_RDI);
  } while (iVar2 == 1);
  if (iVar2 == -1) {
    local_4 = -3;
  }
  else if (((iVar2 == 0) && (*(long *)(in_RDI + 0x20) != 0)) &&
          (*(ulong *)(in_RDI + 0x20) < (ulong)*(uint *)((long)puVar1 + 0x54))) {
    local_4 = -4;
  }
  else {
    (*(code *)puVar1[3])(in_RDI);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8);
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) - *(long *)(in_RDI + 0x20);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aec_decode(struct aec_stream *strm, int flush)
{
    /**
       Finite-state machine implementation of the adaptive entropy
       decoder.

       Can work with one byte input und one sample output buffers. If
       enough buffer space is available, then faster implementations
       of the states are called. Inspired by zlib.
    */

    strm->total_in += strm->avail_in;
    strm->total_out += strm->avail_out;

    struct internal_state *state = strm->state;
    int status;
    do {
        status = state->mode(strm);
    } while (status == M_CONTINUE);

    if (status == M_ERROR)
        return AEC_DATA_ERROR;

    if (status == M_EXIT && strm->avail_out > 0 &&
        strm->avail_out < state->bytes_per_sample)
        return AEC_MEM_ERROR;

    state->flush_output(strm);

    strm->total_in -= strm->avail_in;
    strm->total_out -= strm->avail_out;

    return AEC_OK;
}